

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O0

void btGeometryUtil::getPlaneEquationsFromVertices
               (btAlignedObjectArray<btVector3> *vertices,
               btAlignedObjectArray<btVector3> *planeEquationsOut)

{
  bool bVar1;
  btScalar *pbVar2;
  btAlignedObjectArray<btVector3> *in_RDI;
  btScalar bVar3;
  btVector3 bVar4;
  int ww;
  btScalar normalSign;
  btVector3 edge1;
  btVector3 edge0;
  btVector3 planeEquation;
  btVector3 *N3;
  int k;
  btVector3 *N2;
  int j;
  btVector3 *N1;
  int i;
  int numvertices;
  undefined4 in_stack_ffffffffffffff38;
  btScalar in_stack_ffffffffffffff3c;
  btVector3 in_stack_ffffffffffffff40;
  btVector3 in_stack_ffffffffffffff50;
  int local_a0;
  btScalar local_98 [2];
  btScalar local_90 [2];
  btScalar local_88 [2];
  btScalar abStack_80 [2];
  btVector3 local_78;
  btVector3 local_68;
  btVector3 local_50;
  btVector3 *local_40;
  int local_34;
  btVector3 *local_30;
  int local_24;
  btVector3 *local_20;
  int local_18;
  int local_14;
  btAlignedObjectArray<btVector3> *local_8;
  
  local_8 = in_RDI;
  local_14 = btAlignedObjectArray<btVector3>::size(in_RDI);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_20 = btAlignedObjectArray<btVector3>::operator[](local_8,local_18);
    local_24 = local_18;
    while (local_24 = local_24 + 1, local_24 < local_14) {
      local_30 = btAlignedObjectArray<btVector3>::operator[](local_8,local_24);
      local_34 = local_24;
      while (local_34 = local_34 + 1, local_34 < local_14) {
        local_40 = btAlignedObjectArray<btVector3>::operator[](local_8,local_34);
        btVector3::btVector3(&local_50);
        btVector3::btVector3(&local_68);
        btVector3::btVector3(&local_78);
        bVar4 = operator-(in_stack_ffffffffffffff50.m_floats._0_8_,
                          in_stack_ffffffffffffff40.m_floats._8_8_);
        local_88 = bVar4.m_floats._0_8_;
        abStack_80 = bVar4.m_floats._8_8_;
        local_68.m_floats[0] = local_88[0];
        local_68.m_floats[1] = local_88[1];
        local_68.m_floats[2] = abStack_80[0];
        local_68.m_floats[3] = abStack_80[1];
        bVar4 = operator-(in_stack_ffffffffffffff50.m_floats._0_8_,
                          in_stack_ffffffffffffff40.m_floats._8_8_);
        local_98 = bVar4.m_floats._0_8_;
        local_78.m_floats[0] = local_98[0];
        local_78.m_floats[1] = local_98[1];
        local_90 = bVar4.m_floats._8_8_;
        local_78.m_floats[2] = local_90[0];
        local_78.m_floats[3] = local_90[1];
        for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
          in_stack_ffffffffffffff40 =
               btVector3::cross(in_stack_ffffffffffffff50.m_floats._0_8_,
                                in_stack_ffffffffffffff40.m_floats._8_8_);
          in_stack_ffffffffffffff50 =
               ::operator*(in_stack_ffffffffffffff40.m_floats._0_8_,
                           (btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_50.m_floats._0_8_ = in_stack_ffffffffffffff50.m_floats._0_8_;
          local_50.m_floats._8_8_ = in_stack_ffffffffffffff50.m_floats._8_8_;
          bVar3 = btVector3::length2((btVector3 *)0x154c0e);
          if (0.0001 < bVar3) {
            btVector3::normalize(in_stack_ffffffffffffff40.m_floats._0_8_);
            bVar1 = notExist(in_stack_ffffffffffffff40.m_floats._8_8_,
                             in_stack_ffffffffffffff40.m_floats._0_8_);
            if (bVar1) {
              in_stack_ffffffffffffff3c = btVector3::dot(&local_50,local_20);
              in_stack_ffffffffffffff3c = -in_stack_ffffffffffffff3c;
              pbVar2 = btVector3::operator_cast_to_float_(&local_50);
              pbVar2[3] = in_stack_ffffffffffffff3c;
              bVar1 = areVerticesBehindPlane
                                (in_stack_ffffffffffffff50.m_floats._8_8_,
                                 in_stack_ffffffffffffff50.m_floats._0_8_,
                                 in_stack_ffffffffffffff40.m_floats[3]);
              if (bVar1) {
                btAlignedObjectArray<btVector3>::push_back
                          (in_stack_ffffffffffffff50.m_floats._0_8_,
                           in_stack_ffffffffffffff40.m_floats._8_8_);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void	btGeometryUtil::getPlaneEquationsFromVertices(btAlignedObjectArray<btVector3>& vertices, btAlignedObjectArray<btVector3>& planeEquationsOut )
{
		const int numvertices = vertices.size();
	// brute force:
	for (int i=0;i<numvertices;i++)
	{
		const btVector3& N1 = vertices[i];
		

		for (int j=i+1;j<numvertices;j++)
		{
			const btVector3& N2 = vertices[j];
				
			for (int k=j+1;k<numvertices;k++)
			{

				const btVector3& N3 = vertices[k];

				btVector3 planeEquation,edge0,edge1;
				edge0 = N2-N1;
				edge1 = N3-N1;
				btScalar normalSign = btScalar(1.);
				for (int ww=0;ww<2;ww++)
				{
					planeEquation = normalSign * edge0.cross(edge1);
					if (planeEquation.length2() > btScalar(0.0001))
					{
						planeEquation.normalize();
						if (notExist(planeEquation,planeEquationsOut))
						{
							planeEquation[3] = -planeEquation.dot(N1);
							
								//check if inside, and replace supportingVertexOut if needed
								if (areVerticesBehindPlane(planeEquation,vertices,btScalar(0.01)))
								{
									planeEquationsOut.push_back(planeEquation);
								}
						}
					}
					normalSign = btScalar(-1.);
				}
			
			}
		}
	}

}